

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O1

void __thiscall leveldb::Harness_Randomized_Test::TestBody(Harness_Randomized_Test *this)

{
  int iVar1;
  uint uVar2;
  UnitTest *this_00;
  uint uVar3;
  ulong uVar4;
  Slice SVar5;
  Random rnd;
  string v;
  uint local_bc;
  long local_b8;
  ulong local_b0;
  Harness *local_a8;
  string local_a0;
  char *local_80;
  size_t sStack_78;
  char local_70 [16];
  Slice local_60;
  string local_50;
  
  local_b8 = 0;
  local_a8 = &this->super_Harness;
  do {
    Harness::Init(local_a8,(TestArgs *)(kTestArgList + local_b8 * 0xc));
    this_00 = testing::UnitTest::GetInstance();
    iVar1 = testing::UnitTest::random_seed(this_00);
    local_bc = iVar1 + 5U & 0x7fffffff;
    if ((local_bc == 0x7fffffff) || (local_bc == 0)) {
      local_bc = 1;
    }
    local_b8 = local_b8 + 1;
    uVar4 = 0;
    do {
      uVar2 = (int)uVar4 * -0x33333333;
      local_b0 = uVar4;
      if ((uVar2 >> 1 | (uint)((uVar2 & 1) != 0) << 0x1f) < 0x1999999a) {
        fprintf(_stderr,"case %d of %d: num_entries = %d\n",local_b8,0x10,uVar4);
      }
      uVar2 = (uint)local_b0;
      uVar4 = local_b0 & 0xffffffff;
      while (uVar2 != 0) {
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        uVar3 = (int)((ulong)local_bc * 0x41a7 >> 0x1f) +
                ((uint)((ulong)local_bc * 0x41a7) & 0x7fffffff);
        uVar2 = uVar3 + 0x80000001;
        if (-1 < (int)uVar3) {
          uVar2 = uVar3;
        }
        local_a0._M_string_length = 0;
        uVar3 = (int)((ulong)uVar2 * 0x41a7 >> 0x1f) + ((uint)((ulong)uVar2 * 0x41a7) & 0x7fffffff);
        local_bc = uVar3 + 0x80000001;
        if (-1 < (int)uVar3) {
          local_bc = uVar3;
        }
        local_a0.field_2._M_local_buf[0] = '\0';
        test::RandomKey_abi_cxx11_
                  (&local_50,(test *)&local_bc,
                   (Random *)(ulong)(~(-1 << (sbyte)(uVar2 % 5)) & local_bc),uVar2 % 5);
        uVar3 = (int)((ulong)local_bc * 0x41a7 >> 0x1f) +
                ((uint)((ulong)local_bc * 0x41a7) & 0x7fffffff);
        uVar2 = uVar3 + 0x80000001;
        if (-1 < (int)uVar3) {
          uVar2 = uVar3;
        }
        uVar3 = (int)((ulong)uVar2 * 0x41a7 >> 0x1f) + ((uint)((ulong)uVar2 * 0x41a7) & 0x7fffffff);
        local_bc = uVar3 + 0x80000001;
        if (-1 < (int)uVar3) {
          local_bc = uVar3;
        }
        SVar5 = test::RandomString((Random *)&local_bc,
                                   ~(-1 << ((char)uVar2 + (char)(uVar2 / 6) * -6 & 0x1fU)) &
                                   local_bc,&local_a0);
        local_80 = local_70;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,SVar5.data_,SVar5.data_ + SVar5.size_);
        local_60.data_ = local_80;
        local_60.size_ = sStack_78;
        Constructor::Add(local_a8->constructor_,&local_50,&local_60);
        if (local_80 != local_70) {
          operator_delete(local_80);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        uVar2 = (int)uVar4 - 1;
        uVar4 = (ulong)uVar2;
      }
      Harness::Test(local_a8,(Random *)&local_bc);
      uVar2 = (uint)local_b0;
      uVar3 = uVar2 + 1;
      if (0x31 < uVar2) {
        uVar3 = uVar2 + 200;
      }
      uVar4 = (ulong)uVar3;
    } while (uVar3 < 2000);
  } while (local_b8 != 0x10);
  return;
}

Assistant:

TEST_F(Harness, Randomized) {
  for (int i = 0; i < kNumTestArgs; i++) {
    Init(kTestArgList[i]);
    Random rnd(test::RandomSeed() + 5);
    for (int num_entries = 0; num_entries < 2000;
         num_entries += (num_entries < 50 ? 1 : 200)) {
      if ((num_entries % 10) == 0) {
        std::fprintf(stderr, "case %d of %d: num_entries = %d\n", (i + 1),
                     int(kNumTestArgs), num_entries);
      }
      for (int e = 0; e < num_entries; e++) {
        std::string v;
        Add(test::RandomKey(&rnd, rnd.Skewed(4)),
            test::RandomString(&rnd, rnd.Skewed(5), &v).ToString());
      }
      Test(&rnd);
    }
  }
}